

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

mat4 * lookat(vec3f eye,vec3f center,vec3f up)

{
  double dVar1;
  vec<3UL,_double> *pvVar2;
  double *pdVar3;
  vec<4UL,_double> *pvVar4;
  mat<4UL,_4UL> *in_RDI;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  undefined1 local_80 [8];
  vec3f y;
  undefined1 local_50 [8];
  vec3f x;
  undefined1 local_20 [8];
  vec3f z;
  
  operator-((vec<3UL,_double> *)&x.z,(vec<3UL,_double> *)&stack0x00000008,(vec<3UL,_double> *)&eye.z
           );
  pvVar2 = vec<3UL,_double>::normalize((vec<3UL,_double> *)&x.z);
  local_20 = (undefined1  [8])pvVar2->x;
  z.x = pvVar2->y;
  z.y = pvVar2->z;
  cross((vec3f *)&y.z,(vec3f *)&center.z,(vec3f *)local_20);
  pvVar2 = vec<3UL,_double>::normalize((vec<3UL,_double> *)&y.z);
  local_50 = (undefined1  [8])pvVar2->x;
  x.x = pvVar2->y;
  x.y = pvVar2->z;
  cross((vec3f *)local_98,(vec3f *)local_20,(vec3f *)local_50);
  pvVar2 = vec<3UL,_double>::normalize((vec<3UL,_double> *)local_98);
  local_80 = (undefined1  [8])pvVar2->x;
  y.x = pvVar2->y;
  y.y = pvVar2->z;
  mat<4UL,_4UL>::identity();
  for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_50,(long)local_9c);
    dVar1 = *pdVar3;
    pvVar4 = mat<4UL,_4UL>::operator[](in_RDI,0);
    pdVar3 = vec<4UL,_double>::operator[](pvVar4,(long)local_9c);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_80,(long)local_9c);
    dVar1 = *pdVar3;
    pvVar4 = mat<4UL,_4UL>::operator[](in_RDI,1);
    pdVar3 = vec<4UL,_double>::operator[](pvVar4,(long)local_9c);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_20,(long)local_9c);
    dVar1 = *pdVar3;
    pvVar4 = mat<4UL,_4UL>::operator[](in_RDI,2);
    pdVar3 = vec<4UL,_double>::operator[](pvVar4,(long)local_9c);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)&eye.z,(long)local_9c);
    dVar1 = *pdVar3;
    pvVar4 = mat<4UL,_4UL>::operator[](in_RDI,(long)local_9c);
    pdVar3 = vec<4UL,_double>::operator[](pvVar4,3);
    *pdVar3 = -dVar1;
  }
  return in_RDI;
}

Assistant:

mat4 lookat(vec3f eye, vec3f center, vec3f up)
{
    vec3f z = (eye - center).normalize();
    vec3f x = cross(up, z).normalize();
    vec3f y = cross(z, x).normalize();
    mat4 ModelView = mat4::identity();
    for (int i = 0; i < 3; i++) {
        ModelView[0][i] = x[i];
        ModelView[1][i] = y[i];
        ModelView[2][i] = z[i];
        ModelView[i][3] = -center[i];
    }
    return ModelView;
}